

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.cpp
# Opt level: O0

void __thiscall
CChromeTracer::writeDeviceTiming
          (CChromeTracer *this,char *name,uint64_t queuedTime,uint64_t submitTime,uint64_t startTime
          ,uint64_t endTime,uint64_t id)

{
  long lVar1;
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_stack_00000008;
  int size;
  size_t state;
  double usDeltas [3];
  double usStarts [3];
  ulong local_70;
  double local_68 [4];
  double local_48 [7];
  undefined8 local_10;
  
  auVar2._8_4_ = (int)((ulong)in_RDX >> 0x20);
  auVar2._0_8_ = in_RDX;
  auVar2._12_4_ = 0x45300000;
  local_48[0] = ((auVar2._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0)) / 1000.0;
  auVar3._8_4_ = (int)((ulong)in_RCX >> 0x20);
  auVar3._0_8_ = in_RCX;
  auVar3._12_4_ = 0x45300000;
  local_48[1] = ((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_RCX) - 4503599627370496.0)) / 1000.0;
  auVar4._8_4_ = (int)((ulong)in_R8 >> 0x20);
  auVar4._0_8_ = in_R8;
  auVar4._12_4_ = 0x45300000;
  local_48[2] = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_R8) - 4503599627370496.0)) / 1000.0;
  lVar1 = in_RCX - in_RDX;
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  local_68[0] = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000.0;
  lVar1 = in_R8 - in_RCX;
  auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar6._0_8_ = lVar1;
  auVar6._12_4_ = 0x45300000;
  local_68[1] = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000.0;
  lVar1 = in_R9 - in_R8;
  auVar7._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar7._0_8_ = lVar1;
  auVar7._12_4_ = 0x45300000;
  local_68[2] = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000.0;
  local_10 = in_RSI;
  for (local_70 = 0; local_70 < 3; local_70 = local_70 + 1) {
    snprintf((char *)(in_RDI + 0x240),0x4000,
             "{\"ph\":\"X\",\"pid\":%lu,\"tid\":\"%s\",\"name\":\"%s %s\",\"ts\":%.3f,\"dur\":%.3f,\"cname\":\"%s\",\"args\":{\"id\":%lu}},\n"
             ,local_48[local_70],local_68[local_70],*(undefined8 *)(in_RDI + 0x30),local_10,local_10
             ,suffixes[local_70],colours[local_70],in_stack_00000008);
    std::ostream::write((char *)(in_RDI + 0x40),in_RDI + 0x240);
  }
  return;
}

Assistant:

void CChromeTracer::writeDeviceTiming(
    const char* name,
    uint64_t queuedTime,
    uint64_t submitTime,
    uint64_t startTime,
    uint64_t endTime,
    uint64_t id )
{
    const double    usStarts[cNumStates] = {
        queuedTime / 1000.0,
        submitTime / 1000.0,
        startTime / 1000.0,
    };
    const double    usDeltas[cNumStates] = {
        (submitTime - queuedTime) / 1000.0,
        (startTime - submitTime) / 1000.0,
        (endTime - startTime) / 1000.0,
    };

    for( size_t state = 0; state < cNumStates; state++ )
    {
        int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
            "{\"ph\":\"X\",\"pid\":%" PRIu64 ",\"tid\":\"%s\",\"name\":\"%s %s\""
            ",\"ts\":%.3f,\"dur\":%.3f,\"cname\":\"%s\",\"args\":{\"id\":%" PRIu64 "}},\n",
            m_ProcessId,
            name,
            name,
            suffixes[state],
            usStarts[state],
            usDeltas[state],
            colours[state],
            id );
        m_TraceFile.write(m_StringBuffer, size);
    }
}